

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyhair2pbrt.cpp
# Opt level: O0

bool __thiscall cyhair::CyHair::Load(CyHair *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  value_type vVar4;
  size_t sVar5;
  ostream *poVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int iVar10;
  char *in_RSI;
  long in_RDI;
  bool bVar11;
  bool bVar12;
  int num_segments;
  size_t i;
  size_t n;
  bool has_color;
  bool has_transparency;
  bool has_thickness;
  bool has_points;
  bool has_segments;
  CyHairHeader header;
  FILE *fp;
  uint local_cc;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff48;
  ulong __n;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff50;
  int local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  FILE *local_20;
  bool local_1;
  
  local_20 = fopen(in_RSI,"rb");
  if (local_20 == (FILE *)0x0) {
    local_1 = false;
  }
  else {
    sVar5 = fread(&local_a0,0x80,1,local_20);
    if (sVar5 == 1) {
      if (local_a0 == 0x52494148) {
        *(undefined4 *)(in_RDI + 0xf8) = local_94;
        *(undefined4 *)(in_RDI + 0x108) = local_8c;
        *(undefined4 *)(in_RDI + 0x10c) = local_88;
        *(undefined4 *)(in_RDI + 0x104) = local_90;
        *(undefined4 *)(in_RDI + 0x110) = local_84;
        *(undefined4 *)(in_RDI + 0x114) = local_80;
        *(undefined4 *)(in_RDI + 0x118) = local_7c;
        bVar11 = (*(uint *)(in_RDI + 0xf8) & 1) != 0;
        bVar12 = (*(uint *)(in_RDI + 0xf8) & 2) != 0;
        uVar1 = *(uint *)(in_RDI + 0xf8);
        uVar2 = *(uint *)(in_RDI + 0xf8);
        uVar3 = *(uint *)(in_RDI + 0xf8);
        *(undefined4 *)(in_RDI + 0xfc) = local_9c;
        *(undefined4 *)(in_RDI + 0x100) = local_98;
        if (bVar12) {
          if ((0 < *(int *)(in_RDI + 0x104)) || (bVar11)) {
            local_cc = in_stack_ffffffffffffff44;
            if (bVar11) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  (in_RDI + 0x80),0);
              sVar5 = fread(pvVar7,(ulong)*(uint *)(in_RDI + 0xfc) << 1,1,local_20);
              local_cc = in_stack_ffffffffffffff44;
              if (sVar5 != 1) {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "Failed to read CyHair segments data.");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                fclose(local_20);
                return false;
              }
            }
            if (bVar12) {
              poVar6 = std::operator<<((ostream *)&std::cout,"[CyHair] Has points.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::vector<float,_std::allocator<float>_>::resize
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x98),0);
              sVar5 = fread(pvVar8,(ulong)*(uint *)(in_RDI + 0x100) * 0xc,1,local_20);
              if (sVar5 != 1) {
                poVar6 = std::operator<<((ostream *)&std::cout,"Failed to read CyHair points data.")
                ;
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                fclose(local_20);
                return false;
              }
              in_stack_ffffffffffffff50 = (vector<float,_std::allocator<float>_> *)0x1;
            }
            if ((uVar1 & 4) != 0) {
              poVar6 = std::operator<<((ostream *)&std::cout,"[CyHair] Has thickness.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::vector<float,_std::allocator<float>_>::resize
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),0);
              sVar5 = fread(pvVar8,(ulong)*(uint *)(in_RDI + 0x100) << 2,1,local_20);
              if (sVar5 != 1) {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "Failed to read CyHair thickness data.");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                fclose(local_20);
                return false;
              }
            }
            if ((uVar2 & 8) != 0) {
              poVar6 = std::operator<<((ostream *)&std::cout,"[CyHair] Has transparency.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::vector<float,_std::allocator<float>_>::resize
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)(in_RDI + 200),0);
              sVar5 = fread(pvVar8,(ulong)*(uint *)(in_RDI + 0x100) << 2,1,local_20);
              if (sVar5 != 1) {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "Failed to read CyHair transparencies data.");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                fclose(local_20);
                return false;
              }
            }
            if ((uVar3 & 0x10) != 0) {
              poVar6 = std::operator<<((ostream *)&std::cout,"[CyHair] Has color.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::vector<float,_std::allocator<float>_>::resize
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xe0),0);
              sVar5 = fread(pvVar8,(ulong)*(uint *)(in_RDI + 0x100) * 0xc,1,local_20);
              if (sVar5 != 1) {
                poVar6 = std::operator<<((ostream *)&std::cout,"Failed to read CyHair colors data.")
                ;
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                fclose(local_20);
                return false;
              }
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (in_RDI + 0x120),0);
            *pvVar9 = 0;
            for (__n = 1; __n < *(uint *)(in_RDI + 0xfc); __n = __n + 1) {
              bVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  CONCAT44(local_cc,in_stack_ffffffffffffff40));
              if (bVar11) {
                local_cc = *(uint *)(in_RDI + 0x104);
              }
              else {
                pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                    (in_RDI + 0x80),__n - 1);
                local_cc = (uint)*pvVar7;
              }
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (in_RDI + 0x120),__n - 1);
              vVar4 = *pvVar9;
              iVar10 = local_cc + 1;
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (in_RDI + 0x120),__n);
              *pvVar9 = vVar4 + iVar10;
            }
            local_1 = true;
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"No valid segment information in CyHair."
                                    );
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_1 = false;
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"No point data in CyHair.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_1 = false;
        }
      }
      else {
        fclose(local_20);
        local_1 = false;
      }
    }
    else {
      fclose(local_20);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CyHair::Load(const char *filename) {
  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    return false;
  }

  assert(sizeof(CyHairHeader) == 128);
  CyHairHeader header;

  if (1 != fread(&header, 128, 1, fp)) {
    fclose(fp);
    return false;
  }
  if (memcmp(header.magic, "HAIR", 4) != 0) {
    fclose(fp);
    return false;
  }

  flags_ = header.flags;
  default_thickness_ = header.default_thickness;
  default_transparency_ = header.default_transparency;
  default_segments_ = static_cast<int>(header.default_segments);
  default_color_[0] = header.default_color[0];
  default_color_[1] = header.default_color[1];
  default_color_[2] = header.default_color[2];

  const bool has_segments = flags_ & 0x1;
  const bool has_points = flags_ & 0x2;
  const bool has_thickness = flags_ & 0x4;
  const bool has_transparency = flags_ & 0x8;
  const bool has_color = flags_ & 0x10;

  num_strands_ = header.num_strands;
  total_points_ = header.total_points;

  if (!has_points) {
    std::cout << "No point data in CyHair." << std::endl;
    return false;
  }

  if ((default_segments_ < 1) && (!has_segments)) {
    std::cout << "No valid segment information in CyHair." << std::endl;
    return false;
  }

  // First read all strand data from a file.
  if (has_segments) {
    segments_.resize(num_strands_);
    if (1 !=
        fread(&segments_[0], sizeof(unsigned short) * num_strands_, 1, fp)) {
      std::cout << "Failed to read CyHair segments data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_points) {
    std::cout << "[CyHair] Has points." << std::endl;
    points_.resize(3 * total_points_);
    size_t n = fread(&points_[0], total_points_ * sizeof(float) * 3, 1, fp);
    if (1 != n) {
      std::cout << "Failed to read CyHair points data." << std::endl;
      fclose(fp);
      return false;
    }
  }
  if (has_thickness) {
    std::cout << "[CyHair] Has thickness." << std::endl;
    thicknesses_.resize(total_points_);
    if (1 != fread(&thicknesses_[0], total_points_ * sizeof(float), 1, fp)) {
      std::cout << "Failed to read CyHair thickness data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_transparency) {
    std::cout << "[CyHair] Has transparency." << std::endl;
    transparencies_.resize(total_points_);
    if (1 != fread(&transparencies_[0], total_points_ * sizeof(float), 1, fp)) {
      std::cout << "Failed to read CyHair transparencies data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_color) {
    std::cout << "[CyHair] Has color." << std::endl;
    colors_.resize(3 * total_points_);
    if (1 != fread(&colors_[0], total_points_ * sizeof(float) * 3, 1, fp)) {
      std::cout << "Failed to read CyHair colors data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  // Build strand offset table.
  strand_offsets_.resize(num_strands_);
  strand_offsets_[0] = 0;
  for (size_t i = 1; i < num_strands_; i++) {
    int num_segments = segments_.empty() ? default_segments_ : segments_[i - 1];
    strand_offsets_[i] =
        strand_offsets_[i - 1] + static_cast<unsigned int>(num_segments + 1);
  }

  return true;
}